

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_simple
                   (char_t *s,char_t end_quote)

{
  char_t *pcVar1;
  byte bVar2;
  byte *s_00;
  gap g;
  gap local_38;
  
  local_38.end = (char_t *)0x0;
  local_38.size = 0;
  do {
    do {
      s_00 = (byte *)s;
      bVar2 = *s_00;
      if (((anonymous_namespace)::chartype_table[bVar2] & 2) != 0) goto LAB_00113967;
      bVar2 = s_00[1];
      if (((anonymous_namespace)::chartype_table[bVar2] & 2) != 0) {
        s_00 = s_00 + 1;
        goto LAB_00113967;
      }
      bVar2 = s_00[2];
      if (((anonymous_namespace)::chartype_table[bVar2] & 2) != 0) {
        s_00 = s_00 + 2;
        goto LAB_00113967;
      }
      bVar2 = s_00[3];
      s = (char_t *)(s_00 + 4);
    } while (((anonymous_namespace)::chartype_table[bVar2] & 2) == 0);
    s_00 = s_00 + 3;
LAB_00113967:
    if (bVar2 == end_quote) {
      pcVar1 = gap::flush(&local_38,(char_t *)s_00);
      *pcVar1 = '\0';
      return (char_t *)(s_00 + 1);
    }
    if (bVar2 == 0x26) {
      s = strconv_escape((char_t *)s_00,&local_38);
    }
    else {
      if (bVar2 == 0) {
        return (char_t *)0x0;
      }
      s = (char_t *)(s_00 + 1);
    }
  } while( true );
}

Assistant:

static char_t* parse_simple(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_attr));

				if (*s == end_quote)
				{
					*g.flush(s) = 0;

					return s + 1;
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return 0;
				}
				else ++s;
			}
		}